

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O1

bool __thiscall btVoronoiSimplexSolver::updateClosestVectorAndPoints(btVoronoiSimplexSolver *this)

{
  btUsageBitfield *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  byte bVar17;
  bool bVar18;
  undefined4 extraout_EAX;
  int iVar19;
  undefined4 extraout_EAX_00;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 local_18;
  
  if (this->m_needsUpdate != true) goto LAB_00184b3c;
  (this->m_cachedBC).m_barycentricCoords[0] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
  (this->m_cachedBC).m_degenerate = false;
  bVar17 = *(byte *)&(this->m_cachedBC).m_usedVertices & 0xf0;
  *(byte *)&(this->m_cachedBC).m_usedVertices = bVar17;
  this->m_needsUpdate = false;
  if (4 < (uint)this->m_numVertices) goto switchD_001844da_caseD_0;
  switch(this->m_numVertices) {
  case 1:
    uVar2 = *(undefined8 *)(this->m_simplexPointsP[0].m_floats + 2);
    uVar3 = *(undefined8 *)this->m_simplexPointsQ[0].m_floats;
    uVar16 = *(undefined8 *)(this->m_simplexPointsQ[0].m_floats + 2);
    *(undefined8 *)(this->m_cachedP1).m_floats = *(undefined8 *)this->m_simplexPointsP[0].m_floats;
    *(undefined8 *)((this->m_cachedP1).m_floats + 2) = uVar2;
    *(undefined8 *)(this->m_cachedP2).m_floats = uVar3;
    *(undefined8 *)((this->m_cachedP2).m_floats + 2) = uVar16;
    uVar2 = *(undefined8 *)(this->m_cachedP1).m_floats;
    uVar3 = *(undefined8 *)(this->m_cachedP2).m_floats;
    auVar7._4_4_ = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20);
    auVar7._0_4_ = (float)uVar2 - (float)uVar3;
    auVar7._8_4_ = (this->m_cachedP1).m_floats[2] - (this->m_cachedP2).m_floats[2];
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar7;
    (this->m_cachedBC).m_barycentricCoords[0] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    (this->m_cachedBC).m_degenerate = false;
    *(byte *)&(this->m_cachedBC).m_usedVertices = bVar17;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0;
    (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    this->m_cachedValidClosest = true;
    break;
  case 2:
    fVar26 = this->m_simplexVectorW[0].m_floats[0];
    fVar23 = this->m_simplexVectorW[0].m_floats[1];
    fVar22 = 0.0;
    fVar25 = this->m_simplexVectorW[0].m_floats[2];
    fVar21 = this->m_simplexVectorW[1].m_floats[0] - fVar26;
    fVar27 = this->m_simplexVectorW[1].m_floats[1] - fVar23;
    fVar24 = this->m_simplexVectorW[1].m_floats[2] - fVar25;
    fVar26 = (0.0 - fVar25) * fVar24 + (0.0 - fVar26) * fVar21 + (0.0 - fVar23) * fVar27;
    bVar17 = 1;
    if (0.0 < fVar26) {
      fVar22 = fVar24 * fVar24 + fVar21 * fVar21 + fVar27 * fVar27;
      if (fVar22 <= fVar26) {
        fVar22 = 1.0;
        bVar17 = 2;
      }
      else {
        fVar22 = fVar26 / fVar22;
        bVar17 = 3;
      }
    }
    pbVar1 = &(this->m_cachedBC).m_usedVertices;
    *(byte *)pbVar1 = *(byte *)pbVar1 | bVar17;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0 - fVar22;
    (this->m_cachedBC).m_barycentricCoords[1] = fVar22;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    fVar26 = this->m_simplexPointsP[0].m_floats[2];
    uVar2 = *(undefined8 *)this->m_simplexPointsP[1].m_floats;
    uVar3 = *(undefined8 *)this->m_simplexPointsP[0].m_floats;
    fVar21 = (float)uVar3;
    fVar24 = (float)((ulong)uVar3 >> 0x20);
    fVar21 = ((float)uVar2 - fVar21) * fVar22 + fVar21;
    fVar24 = ((float)((ulong)uVar2 >> 0x20) - fVar24) * fVar22 + fVar24;
    auVar11._4_4_ = fVar24;
    auVar11._0_4_ = fVar21;
    auVar11._8_4_ = (this->m_simplexPointsP[1].m_floats[2] - fVar26) * fVar22 + fVar26;
    auVar11._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar11;
    fVar26 = this->m_simplexPointsQ[0].m_floats[2];
    uVar2 = *(undefined8 *)this->m_simplexPointsQ[1].m_floats;
    uVar3 = *(undefined8 *)this->m_simplexPointsQ[0].m_floats;
    fVar23 = (float)uVar3;
    fVar25 = (float)((ulong)uVar3 >> 0x20);
    fVar23 = ((float)uVar2 - fVar23) * fVar22 + fVar23;
    fVar25 = ((float)((ulong)uVar2 >> 0x20) - fVar25) * fVar22 + fVar25;
    auVar6._4_4_ = fVar25;
    auVar6._0_4_ = fVar23;
    auVar6._8_4_ = (this->m_simplexPointsQ[1].m_floats[2] - fVar26) * fVar22 + fVar26;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar6;
    auVar9._4_4_ = fVar24 - fVar25;
    auVar9._0_4_ = fVar21 - fVar23;
    auVar9._8_4_ = (this->m_cachedP1).m_floats[2] - (this->m_cachedP2).m_floats[2];
    auVar9._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar9;
    reduceVertices(this,&(this->m_cachedBC).m_usedVertices);
    auVar10._4_4_ = -(uint)(0.0 <= (this->m_cachedBC).m_barycentricCoords[1]);
    auVar10._0_4_ = -(uint)(0.0 <= (this->m_cachedBC).m_barycentricCoords[0]);
    auVar10._8_4_ = -(uint)(0.0 <= (this->m_cachedBC).m_barycentricCoords[2]);
    auVar10._12_4_ = -(uint)(0.0 <= (this->m_cachedBC).m_barycentricCoords[3]);
    uVar20 = movmskps(extraout_EAX_00,auVar10);
    bVar17 = (byte)uVar20;
    this->m_cachedValidClosest = (bool)(bVar17 >> 1 & bVar17 & bVar17 >> 2 & (bVar17 & 8) >> 3);
    break;
  case 3:
    local_18.m_floats[0] = 0.0;
    local_18.m_floats[1] = 0.0;
    local_18.m_floats[2] = 0.0;
    local_18.m_floats[3] = 0.0;
    closestPtPointTriangle
              (this,&local_18,this->m_simplexVectorW,this->m_simplexVectorW + 1,
               this->m_simplexVectorW + 2,&this->m_cachedBC);
    fVar26 = (this->m_cachedBC).m_barycentricCoords[0];
    fVar23 = (this->m_cachedBC).m_barycentricCoords[1];
    fVar25 = (this->m_cachedBC).m_barycentricCoords[2];
    fVar24 = fVar25 * this->m_simplexPointsP[2].m_floats[0] +
             fVar23 * this->m_simplexPointsP[1].m_floats[0] +
             fVar26 * this->m_simplexPointsP[0].m_floats[0];
    fVar27 = this->m_simplexPointsP[2].m_floats[1] * fVar25 +
             this->m_simplexPointsP[1].m_floats[1] * fVar23 +
             this->m_simplexPointsP[0].m_floats[1] * fVar26;
    auVar14._4_4_ = fVar27;
    auVar14._0_4_ = fVar24;
    auVar14._8_4_ =
         this->m_simplexPointsP[2].m_floats[2] * fVar25 +
         this->m_simplexPointsP[1].m_floats[2] * fVar23 +
         this->m_simplexPointsP[0].m_floats[2] * fVar26;
    auVar14._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar14;
    fVar22 = fVar25 * this->m_simplexPointsQ[2].m_floats[0] +
             fVar23 * this->m_simplexPointsQ[1].m_floats[0] +
             fVar26 * this->m_simplexPointsQ[0].m_floats[0];
    fVar21 = this->m_simplexPointsQ[2].m_floats[1] * fVar25 +
             this->m_simplexPointsQ[1].m_floats[1] * fVar23 +
             this->m_simplexPointsQ[0].m_floats[1] * fVar26;
    auVar5._4_4_ = fVar21;
    auVar5._0_4_ = fVar22;
    auVar5._8_4_ = this->m_simplexPointsQ[2].m_floats[2] * fVar25 +
                   this->m_simplexPointsQ[1].m_floats[2] * fVar23 +
                   this->m_simplexPointsQ[0].m_floats[2] * fVar26;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar5;
    auVar12._4_4_ = fVar27 - fVar21;
    auVar12._0_4_ = fVar24 - fVar22;
    auVar12._8_4_ = (this->m_cachedP1).m_floats[2] - (this->m_cachedP2).m_floats[2];
    auVar12._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar12;
LAB_0018494d:
    reduceVertices(this,&(this->m_cachedBC).m_usedVertices);
    auVar8._4_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[1] < 0.0);
    auVar8._0_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[0] < 0.0);
    auVar8._8_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[2] < 0.0);
    auVar8._12_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[3] < 0.0);
    iVar19 = movmskps(extraout_EAX,auVar8);
    this->m_cachedValidClosest = iVar19 == 0;
    break;
  case 4:
    local_18.m_floats[0] = 0.0;
    local_18.m_floats[1] = 0.0;
    local_18.m_floats[2] = 0.0;
    local_18.m_floats[3] = 0.0;
    bVar18 = closestPtPointTetrahedron
                       (this,&local_18,this->m_simplexVectorW,this->m_simplexVectorW + 1,
                        this->m_simplexVectorW + 2,this->m_simplexVectorW + 3,&this->m_cachedBC);
    if (bVar18) {
      fVar26 = (this->m_cachedBC).m_barycentricCoords[0];
      fVar23 = (this->m_cachedBC).m_barycentricCoords[1];
      fVar25 = (this->m_cachedBC).m_barycentricCoords[2];
      fVar22 = (this->m_cachedBC).m_barycentricCoords[3];
      fVar27 = fVar22 * this->m_simplexPointsP[3].m_floats[0] +
               fVar25 * this->m_simplexPointsP[2].m_floats[0] +
               fVar23 * this->m_simplexPointsP[1].m_floats[0] +
               fVar26 * this->m_simplexPointsP[0].m_floats[0];
      fVar28 = this->m_simplexPointsP[3].m_floats[1] * fVar22 +
               this->m_simplexPointsP[2].m_floats[1] * fVar25 +
               this->m_simplexPointsP[1].m_floats[1] * fVar23 +
               this->m_simplexPointsP[0].m_floats[1] * fVar26;
      auVar15._4_4_ = fVar28;
      auVar15._0_4_ = fVar27;
      auVar15._8_4_ =
           this->m_simplexPointsP[3].m_floats[2] * fVar22 +
           this->m_simplexPointsP[2].m_floats[2] * fVar25 +
           this->m_simplexPointsP[1].m_floats[2] * fVar23 +
           this->m_simplexPointsP[0].m_floats[2] * fVar26;
      auVar15._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar15;
      fVar21 = fVar22 * this->m_simplexPointsQ[3].m_floats[0] +
               fVar25 * this->m_simplexPointsQ[2].m_floats[0] +
               fVar23 * this->m_simplexPointsQ[1].m_floats[0] +
               fVar26 * this->m_simplexPointsQ[0].m_floats[0];
      fVar24 = this->m_simplexPointsQ[3].m_floats[1] * fVar22 +
               this->m_simplexPointsQ[2].m_floats[1] * fVar25 +
               this->m_simplexPointsQ[1].m_floats[1] * fVar23 +
               this->m_simplexPointsQ[0].m_floats[1] * fVar26;
      auVar4._4_4_ = fVar24;
      auVar4._0_4_ = fVar21;
      auVar4._8_4_ = this->m_simplexPointsQ[3].m_floats[2] * fVar22 +
                     this->m_simplexPointsQ[2].m_floats[2] * fVar25 +
                     this->m_simplexPointsQ[1].m_floats[2] * fVar23 +
                     this->m_simplexPointsQ[0].m_floats[2] * fVar26;
      auVar4._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar4;
      auVar13._4_4_ = fVar28 - fVar24;
      auVar13._0_4_ = fVar27 - fVar21;
      auVar13._8_4_ = (this->m_cachedP1).m_floats[2] - (this->m_cachedP2).m_floats[2];
      auVar13._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar13;
      goto LAB_0018494d;
    }
    if ((this->m_cachedBC).m_degenerate != true) {
      this->m_cachedValidClosest = true;
      (this->m_cachedV).m_floats[0] = 0.0;
      (this->m_cachedV).m_floats[1] = 0.0;
      (this->m_cachedV).m_floats[2] = 0.0;
      (this->m_cachedV).m_floats[3] = 0.0;
      break;
    }
  case 0:
switchD_001844da_caseD_0:
    this->m_cachedValidClosest = false;
  }
LAB_00184b3c:
  return this->m_cachedValidClosest;
}

Assistant:

bool	btVoronoiSimplexSolver::updateClosestVectorAndPoints()
{
	
	if (m_needsUpdate)
	{
		m_cachedBC.reset();

		m_needsUpdate = false;

		switch (numVertices())
		{
		case 0:
				m_cachedValidClosest = false;
				break;
		case 1:
			{
				m_cachedP1 = m_simplexPointsP[0];
				m_cachedP2 = m_simplexPointsQ[0];
				m_cachedV = m_cachedP1-m_cachedP2; //== m_simplexVectorW[0]
				m_cachedBC.reset();
				m_cachedBC.setBarycentricCoordinates(btScalar(1.),btScalar(0.),btScalar(0.),btScalar(0.));
				m_cachedValidClosest = m_cachedBC.isValid();
				break;
			};
		case 2:
			{
			//closest point origin from line segment
					const btVector3& from = m_simplexVectorW[0];
					const btVector3& to = m_simplexVectorW[1];
					btVector3 nearest;

					btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
					btVector3 diff = p - from;
					btVector3 v = to - from;
					btScalar t = v.dot(diff);
					
					if (t > 0) {
						btScalar dotVV = v.dot(v);
						if (t < dotVV) {
							t /= dotVV;
							diff -= t*v;
							m_cachedBC.m_usedVertices.usedVertexA = true;
							m_cachedBC.m_usedVertices.usedVertexB = true;
						} else {
							t = 1;
							diff -= v;
							//reduce to 1 point
							m_cachedBC.m_usedVertices.usedVertexB = true;
						}
					} else
					{
						t = 0;
						//reduce to 1 point
						m_cachedBC.m_usedVertices.usedVertexA = true;
					}
					m_cachedBC.setBarycentricCoordinates(1-t,t);
					nearest = from + t*v;

					m_cachedP1 = m_simplexPointsP[0] + t * (m_simplexPointsP[1] - m_simplexPointsP[0]);
					m_cachedP2 = m_simplexPointsQ[0] + t * (m_simplexPointsQ[1] - m_simplexPointsQ[0]);
					m_cachedV = m_cachedP1 - m_cachedP2;
					
					reduceVertices(m_cachedBC.m_usedVertices);

					m_cachedValidClosest = m_cachedBC.isValid();
					break;
			}
		case 3: 
			{ 
				//closest point origin from triangle 
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.)); 

				const btVector3& a = m_simplexVectorW[0]; 
				const btVector3& b = m_simplexVectorW[1]; 
				const btVector3& c = m_simplexVectorW[2]; 

				closestPtPointTriangle(p,a,b,c,m_cachedBC); 
				m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedV = m_cachedP1-m_cachedP2; 

				reduceVertices (m_cachedBC.m_usedVertices); 
				m_cachedValidClosest = m_cachedBC.isValid(); 

				break; 
			}
		case 4:
			{

				
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
				
				const btVector3& a = m_simplexVectorW[0];
				const btVector3& b = m_simplexVectorW[1];
				const btVector3& c = m_simplexVectorW[2];
				const btVector3& d = m_simplexVectorW[3];

				bool hasSeperation = closestPtPointTetrahedron(p,a,b,c,d,m_cachedBC);

				if (hasSeperation)
				{

					m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsP[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsQ[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedV = m_cachedP1-m_cachedP2;
					reduceVertices (m_cachedBC.m_usedVertices);
				} else
				{
//					printf("sub distance got penetration\n");

					if (m_cachedBC.m_degenerate)
					{
						m_cachedValidClosest = false;
					} else
					{
						m_cachedValidClosest = true;
						//degenerate case == false, penetration = true + zero
						m_cachedV.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
					}
					break;
				}

				m_cachedValidClosest = m_cachedBC.isValid();

				//closest point origin from tetrahedron
				break;
			}
		default:
			{
				m_cachedValidClosest = false;
			}
		};
	}

	return m_cachedValidClosest;

}